

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O3

Vec_Wrd_t * Gia_ManComputeTruths(Gia_Man_t *p,int nCutSize,int nLutNum,int fReverse)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  word wVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  word *__ptr;
  byte bVar6;
  int iVar7;
  size_t __size;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  Vec_Int_t vLeaves;
  long local_70;
  Vec_Int_t local_60;
  word *local_50;
  Gia_Man_t *local_48;
  ulong local_40;
  long local_38;
  
  bVar6 = (char)nCutSize - 6;
  uVar8 = 1 << (bVar6 & 0x1f);
  if (nCutSize < 7) {
    uVar8 = 1;
  }
  local_70._0_4_ = 0;
  if (nCutSize < 7) {
    bVar6 = 0;
  }
  iVar18 = nLutNum << (bVar6 & 0x1f);
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar7 = iVar18;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    local_50 = (word *)0x0;
  }
  else {
    local_50 = (word *)malloc((long)iVar7 << 3);
  }
  pVVar4->pArray = local_50;
  Gia_ObjComputeTruthTableStart(p,nCutSize);
  if (1 < p->nObjs) {
    local_40 = (ulong)uVar8;
    lVar19 = 1;
    local_70 = 0;
    local_48 = p;
    do {
      pVVar1 = p->vMapping;
      if (pVVar1->nSize <= lVar19) goto LAB_006b3164;
      piVar2 = pVVar1->pArray;
      uVar15 = piVar2[lVar19];
      if ((ulong)uVar15 != 0) {
        if (((int)uVar15 < 0) || ((uint)pVVar1->nSize <= uVar15)) {
LAB_006b3164:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        local_60.nCap = piVar2[uVar15];
        uVar17 = (ulong)(uint)local_60.nCap;
        local_60.nSize = local_60.nCap;
        if (pVVar1->nSize <= lVar19) goto LAB_006b3164;
        lVar10 = (long)piVar2[lVar19];
        if ((lVar10 < 0) || ((uint)pVVar1->nSize <= (uint)piVar2[lVar19])) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        local_60.pArray = piVar2 + lVar10 + 1;
        if (0 < local_60.nCap) {
          piVar11 = piVar2 + lVar10 + 2;
          uVar12 = 0;
          uVar9 = uVar17;
          do {
            uVar9 = uVar9 - 1;
            uVar14 = uVar12 + 1;
            if (uVar14 < uVar17) {
              uVar16 = 0;
              do {
                if (local_60.pArray[uVar12] == piVar11[uVar16]) {
                  __assert_fail("Vec_IntCheckUniqueSmall(&vLeaves)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                                ,0x99,"Vec_Wrd_t *Gia_ManComputeTruths(Gia_Man_t *, int, int, int)")
                  ;
                }
                uVar16 = uVar16 + 1;
              } while (uVar9 != uVar16);
            }
            piVar11 = piVar11 + 1;
            uVar12 = uVar14;
          } while (uVar14 != uVar17);
          if (local_60.nCap != 1) {
            uVar12 = 1;
            uVar9 = 0;
            do {
              uVar16 = uVar9 & 0xffffffff;
              uVar14 = uVar12;
              do {
                uVar15 = (uint)uVar14;
                if (local_60.pArray[(int)(uint)uVar16] <= piVar2[lVar10 + uVar14 + 1]) {
                  uVar15 = (uint)uVar16;
                }
                uVar14 = uVar14 + 1;
                uVar16 = (ulong)uVar15;
              } while (uVar17 != uVar14);
              iVar18 = local_60.pArray[uVar9];
              local_60.pArray[uVar9] = local_60.pArray[(int)uVar15];
              uVar9 = uVar9 + 1;
              local_60.pArray[(int)uVar15] = iVar18;
              uVar12 = uVar12 + 1;
            } while (uVar9 != local_60.nCap - 1);
            if (1 < local_60.nCap && fReverse == 0) {
              iVar18 = -1;
              lVar10 = 0;
              do {
                iVar13 = local_60.pArray[lVar10];
                local_60.pArray[lVar10] = local_60.pArray[local_60.nCap + iVar18];
                local_60.pArray[local_60.nCap + iVar18] = iVar13;
                lVar10 = lVar10 + 1;
                iVar18 = iVar18 + -1;
              } while (lVar10 < local_60.nCap / 2);
            }
          }
        }
        if (p->nObjs <= lVar19) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pwVar5 = Gia_ObjComputeTruthTableCut(p,p->pObjs + lVar19,&local_60);
        if (0 < (int)uVar8) {
          iVar18 = (int)local_70;
          local_70 = (long)iVar18;
          iVar18 = iVar18 * 2;
          __size = local_70 << 4;
          __ptr = local_50;
          uVar17 = local_40;
          local_38 = lVar19;
          do {
            wVar3 = *pwVar5;
            iVar13 = iVar7;
            if ((int)local_70 == iVar7) {
              if (local_70 < 0x10) {
                if (__ptr == (word *)0x0) {
                  __ptr = (word *)malloc(0x80);
                }
                else {
                  __ptr = (word *)realloc(__ptr,0x80);
                }
                pVVar4->pArray = __ptr;
                iVar13 = 0x10;
              }
              else {
                if (__ptr == (word *)0x0) {
                  __ptr = (word *)malloc(__size);
                }
                else {
                  __ptr = (word *)realloc(__ptr,__size);
                }
                pVVar4->pArray = __ptr;
                iVar13 = iVar18;
              }
              if (__ptr == (word *)0x0) {
                pVVar4->nSize = iVar7;
                pVVar4->nCap = iVar7;
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                              ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
              }
            }
            iVar7 = iVar13;
            __ptr[local_70] = wVar3;
            local_70 = local_70 + 1;
            pwVar5 = pwVar5 + 1;
            iVar18 = iVar18 + 2;
            __size = __size + 0x10;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
          pVVar4->nSize = (int)local_70;
          pVVar4->nCap = iVar7;
          p = local_48;
          lVar19 = local_38;
          local_50 = __ptr;
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < p->nObjs);
  }
  Gia_ObjComputeTruthTableStop(p);
  if ((iVar7 != 0x10) && ((int)local_70 != iVar7)) {
    __assert_fail("Vec_WrdCap(vTruths) == 16 || Vec_WrdSize(vTruths) == Vec_WrdCap(vTruths)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                  ,0xa4,"Vec_Wrd_t *Gia_ManComputeTruths(Gia_Man_t *, int, int, int)");
  }
  return pVVar4;
}

Assistant:

Vec_Wrd_t * Gia_ManComputeTruths( Gia_Man_t * p, int nCutSize, int nLutNum, int fReverse )
{
    Vec_Wrd_t * vTruths;
    Vec_Int_t vLeaves;
    word * pTruth;
    int i, k, nWords;
    nWords = Abc_Truth6WordNum( nCutSize );
    vTruths = Vec_WrdAlloc( nWords * nLutNum );
    Gia_ObjComputeTruthTableStart( p, nCutSize );
    Gia_ManForEachLut( p, i )
    {
        // collect and sort fanins
        vLeaves.nCap = vLeaves.nSize = Gia_ObjLutSize( p, i );
        vLeaves.pArray = Gia_ObjLutFanins( p, i );
        assert( Vec_IntCheckUniqueSmall(&vLeaves) );
        Vec_IntSelectSort( Vec_IntArray(&vLeaves), Vec_IntSize(&vLeaves) );
        if ( !fReverse )
            Vec_IntReverseOrder( &vLeaves );
        // compute truth table
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, i), &vLeaves );
        for ( k = 0; k < nWords; k++ )
            Vec_WrdPush( vTruths, pTruth[k] );
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
    }
    Gia_ObjComputeTruthTableStop( p );
    assert( Vec_WrdCap(vTruths) == 16 || Vec_WrdSize(vTruths) == Vec_WrdCap(vTruths) );
    return vTruths;
}